

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void MovePos(CLzmaEnc *p,UInt32 num)

{
  int in_ESI;
  undefined8 *in_RDI;
  
  if (in_ESI != 0) {
    *(int *)(in_RDI + 9) = in_ESI + *(int *)(in_RDI + 9);
    (*(code *)in_RDI[5])(*in_RDI,in_ESI);
  }
  return;
}

Assistant:

static void MovePos(CLzmaEnc *p, UInt32 num)
{
  #ifdef SHOW_STAT
  g_STAT_OFFSET += num;
  printf("\n MovePos %u", num);
  #endif
  
  if (num != 0)
  {
    p->additionalOffset += num;
    p->matchFinder.Skip(p->matchFinderObj, num);
  }
}